

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O3

void __thiscall
NewEdgeCalculator::iterateRemainingCovAp
          (NewEdgeCalculator *this,int *tc,bool pe1,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap2,
          bool pe2,double *prob0,AlignmentRecord *ap1,AlignmentRecord *ap2,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap1,
          uint *pos1)

{
  pointer pmVar1;
  uint uVar2;
  uint uVar3;
  pointer pmVar4;
  pointer pmVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  uVar7 = (ulong)*pos1;
  pmVar4 = (cov_ap1->
           super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pmVar5 = (cov_ap1->
           super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = ((long)pmVar5 - (long)pmVar4 >> 3) * -0x5555555555555555;
  if (uVar7 <= uVar6 && uVar6 - uVar7 != 0) {
    do {
      pmVar1 = pmVar4 + uVar7;
      if (pe1 && pe2) {
        uVar2 = AlignmentRecord::getStart2(ap1);
        uVar3 = AlignmentRecord::getEnd2(ap2);
        if ((uVar3 < uVar2) &&
           (uVar2 = pmVar1->ref, uVar3 = AlignmentRecord::getStart2(ap1), uVar3 <= uVar2)) {
          return;
        }
        dVar8 = (this->SIMPSON_MAP).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[pmVar1->ref];
        uVar7 = -(ulong)(dVar8 != 0.0);
        dVar8 = (double)(~uVar7 & 0xbfe34413509f79ff | (ulong)dVar8 & uVar7) + *prob0;
        uVar7 = (ulong)*pos1;
        pmVar4 = (cov_ap1->
                 super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pmVar5 = (cov_ap1->
                 super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        if (pmVar1->read !=
            (cov_ap2->
            super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
            )._M_impl.super__Vector_impl_data._M_finish[-1].read) {
          return;
        }
        dVar8 = (this->SIMPSON_MAP).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[pmVar1->ref];
        uVar6 = -(ulong)(dVar8 != 0.0);
        dVar8 = (double)(~uVar6 & 0xbfe34413509f79ff | (ulong)dVar8 & uVar6) + *prob0;
      }
      *prob0 = dVar8;
      *pos1 = (int)uVar7 + 1;
      *tc = *tc + 1;
      uVar7 = (ulong)*pos1;
      uVar6 = ((long)pmVar5 - (long)pmVar4 >> 3) * -0x5555555555555555;
    } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
  }
  return;
}

Assistant:

void NewEdgeCalculator::iterateRemainingCovAp(int& tc, bool pe1, const std::vector<AlignmentRecord::mapValue>& cov_ap2, bool pe2, double& prob0, const AlignmentRecord& ap1, const AlignmentRecord& ap2, const std::vector<AlignmentRecord::mapValue>& cov_ap1, unsigned int& pos1) const
{
    while(pos1 < cov_ap1.size()){
        auto& v1 = cov_ap1[pos1];
        if(pe1 && pe2){
            if(ap1.getStart2() > ap2.getEnd2() && v1.ref >= ap1.getStart2()) break;
            else {
                calculateProb0(v1,prob0);
                pos1++;
                tc++;
            }
        }
        else if (v1.read == cov_ap2.back().read){
            calculateProb0(v1,prob0);
            pos1++;
            tc++;
        } else break;
    }
}